

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_vector_erase(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  reference piVar2;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  allocator<int> local_b9;
  int local_b8 [2];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  list<int,_std::allocator<int>_> base;
  const_iterator local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  iterator i;
  allocator<int> local_49;
  int local_48 [6];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> l;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_48[4] = 5;
  local_30 = local_48;
  local_28 = 5;
  std::allocator<int>::allocator(&local_49);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l_00,&local_49);
  std::allocator<int>::~allocator(&local_49);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  while( true ) {
    local_70._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_20);
    bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_68);
    if (*piVar2 < 3) {
      base.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
           (size_t)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++(&local_68,0);
    }
    else {
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_80,
                 &local_68);
      local_78 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                  ((vector<int,_std::allocator<int>_> *)local_20,local_80);
      local_68._M_current = local_78;
    }
  }
  local_b8[0] = 1;
  local_b8[1] = 2;
  local_b0 = local_b8;
  local_a8 = 2;
  std::allocator<int>::allocator(&local_b9);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_a0,__l,&local_b9);
  std::allocator<int>::~allocator(&local_b9);
  __first1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_20);
  __last1 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_20);
  __first2 = std::__cxx11::list<int,_std::allocator<int>_>::begin
                       ((list<int,_std::allocator<int>_> *)local_a0);
  __last2 = std::__cxx11::list<int,_std::allocator<int>_>::end
                      ((list<int,_std::allocator<int>_> *)local_a0);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __first1._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __last1._M_current,(_List_iterator<int>)__first2._M_node,
                     (_List_iterator<int>)__last2._M_node);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return bVar1;
}

Assistant:

bool test_vector_erase() {
    auto l = std::vector<int>{1, 2, 3, 4, 5};
    for (auto i = l.begin(); i != l.end();) {
        if (*i >= 3) {
            i = l.erase(i);
            continue;
        }
        i++;
    }
    auto base = std::list<int>{1, 2};
    return std::equal(l.begin(), l.end(), base.begin(), base.end());
}